

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::stage_limits_are_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  VkShaderStageFlagBits VVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  VkSpecializationInfo *pVVar4;
  VkSpecializationMapEntry *pVVar5;
  int iVar6;
  long lVar7;
  __node_base_ptr p_Var8;
  int *piVar9;
  uint32_t *puVar10;
  bool bVar11;
  _Hash_node_base *p_Var12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  _Hash_node_base *p_Var16;
  _Hash_node_base *p_Var17;
  pthread_mutex_t *ppVar18;
  uint32_t wg_size [3];
  uint32_t limit_workgroup_size [3];
  uint local_60 [4];
  undefined8 local_50;
  uint32_t local_48;
  pthread_mutex_t *local_40;
  uint local_34;
  
  if (info->pName == (char *)0x0) {
    return false;
  }
  VVar1 = info->stage;
  if (VVar1 == VK_SHADER_STAGE_MESH_BIT_EXT) {
    local_48 = (this->props).mesh_shader.maxMeshWorkGroupSize[2];
    local_50 = *(undefined8 *)(this->props).mesh_shader.maxMeshWorkGroupSize;
    iVar15 = 0x14f5;
    lVar7 = 0x1324;
  }
  else if (VVar1 == VK_SHADER_STAGE_TASK_BIT_EXT) {
    local_48 = (this->props).mesh_shader.maxTaskWorkGroupSize[2];
    local_50 = *(undefined8 *)(this->props).mesh_shader.maxTaskWorkGroupSize;
    iVar15 = 0x14f4;
    lVar7 = 0x12f8;
  }
  else {
    if (VVar1 != VK_SHADER_STAGE_COMPUTE_BIT) {
      return true;
    }
    local_48 = (this->props2).properties.limits.maxComputeWorkGroupSize[2];
    local_50 = *(undefined8 *)(this->props2).properties.limits.maxComputeWorkGroupSize;
    iVar15 = 5;
    lVar7 = 0x268;
  }
  uVar2 = *(uint *)((this->props2).properties.deviceName + lVar7 + -0x6c);
  ppVar18 = (pthread_mutex_t *)&this->module_to_info_lock;
  iVar6 = pthread_mutex_lock(ppVar18);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  p_Var17 = (_Hash_node_base *)0x0;
  local_34 = uVar2;
  p_Var8 = std::
           _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->module_to_info)._M_h,
                      (ulong)info->module % (this->module_to_info)._M_h._M_bucket_count,
                      &info->module,(__hash_code)info->module);
  if (p_Var8 != (__node_base_ptr)0x0) {
    p_Var17 = p_Var8->_M_nxt;
  }
  bVar11 = true;
  if (p_Var17 != (_Hash_node_base *)0x0) {
    p_Var3 = p_Var17[3]._M_nxt;
    local_40 = ppVar18;
    if (p_Var17[2]._M_nxt == p_Var3) {
      p_Var17 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var16 = (_Hash_node_base *)0x0;
      p_Var12 = p_Var17[2]._M_nxt;
      do {
        p_Var17 = p_Var12;
        p_Var12 = p_Var17 + 0xc;
        if ((iVar15 == *(int *)&p_Var17[10]._M_nxt) &&
           (iVar6 = std::__cxx11::string::compare((char *)(p_Var17 + 6)), iVar6 == 0)) {
          bVar11 = true;
        }
        else {
          bVar11 = false;
          p_Var17 = p_Var16;
        }
      } while ((!bVar11) && (p_Var16 = p_Var17, p_Var12 != p_Var3));
    }
    ppVar18 = local_40;
    if (p_Var17 == (_Hash_node_base *)0x0) {
      bVar11 = true;
    }
    else {
      local_60[2] = 0;
      local_60[0] = 0;
      local_60[1] = 0;
      bVar11 = true;
      if ((*(int *)&p_Var17[10]._M_nxt != 0x14f5) ||
         ((*(uint *)&p_Var17[0xb]._M_nxt <= (this->props).mesh_shader.maxMeshOutputPrimitives &&
          (*(uint *)((long)&p_Var17[10]._M_nxt + 4) <=
           (this->props).mesh_shader.maxMeshOutputVertices)))) {
        pVVar4 = info->pSpecializationInfo;
        lVar7 = 0;
        do {
          local_60[lVar7] = *(uint *)((long)&p_Var17->_M_nxt + lVar7 * 4 + 4);
          if (((pVVar4 != (VkSpecializationInfo *)0x0 & *(byte *)((long)&p_Var17[5]._M_nxt + lVar7))
               == 1) && ((ulong)pVVar4->mapEntryCount != 0)) {
            pVVar5 = pVVar4->pMapEntries;
            lVar13 = 0;
            do {
              if (((*(int *)((long)&pVVar5->constantID + lVar13) ==
                    *(int *)((long)&p_Var17[3]._M_nxt + lVar7 * 4 + 4)) &&
                  (*(long *)((long)&pVVar5->size + lVar13) == 4)) &&
                 (uVar14 = (ulong)*(uint *)((long)&pVVar5->offset + lVar13),
                 uVar14 + 4 <= pVVar4->dataSize)) {
                local_60[lVar7] = *(uint *)((long)pVVar4->pData + uVar14);
                break;
              }
              lVar13 = lVar13 + 0x10;
            } while ((ulong)pVVar4->mapEntryCount << 4 != lVar13);
          }
          if (*(uint *)((long)&local_50 + lVar7 * 4) < local_60[lVar7]) goto LAB_0010f973;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (local_60[1] * local_60[0] * local_60[2] <= local_34) {
          if ((info->flags & 2) == 0) goto LAB_0010f984;
          for (piVar9 = (int *)info->pNext; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 2)) {
            if (*piVar9 == 0x3b9e38e9) goto LAB_0010f9cc;
          }
          piVar9 = (int *)0x0;
LAB_0010f9cc:
          puVar10 = &(this->props).subgroup_size_control.maxSubgroupSize;
          if (piVar9 != (int *)0x0) {
            puVar10 = (uint32_t *)(piVar9 + 4);
          }
          if ((*puVar10 != 0) && (local_60[0] % *puVar10 == 0)) goto LAB_0010f984;
        }
      }
LAB_0010f973:
      bVar11 = false;
    }
  }
LAB_0010f984:
  pthread_mutex_unlock(ppVar18);
  return bVar11;
}

Assistant:

bool FeatureFilter::Impl::stage_limits_are_supported(const VkPipelineShaderStageCreateInfo &info) const
{
	spv::ExecutionModel target_model;
	uint32_t limit_workgroup_size[3];
	uint32_t limit_invocations;

	if (!info.pName)
		return false;

	switch (info.stage)
	{
	case VK_SHADER_STAGE_COMPUTE_BIT:
		target_model = spv::ExecutionModelGLCompute;
		memcpy(limit_workgroup_size, props2.properties.limits.maxComputeWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props2.properties.limits.maxComputeWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_TASK_BIT_EXT:
		target_model = spv::ExecutionModelTaskEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxTaskWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxTaskWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_MESH_BIT_EXT:
		target_model = spv::ExecutionModelMeshEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxMeshWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxMeshWorkGroupInvocations;
		break;

	default:
		// Shouldn't happen. Only happens for invalid input.
		return true;
	}

	std::lock_guard<std::mutex> holder{module_to_info_lock};

	// If we cannot find anything, assume that we're statically okay.
	auto itr = module_to_info.find(info.module);
	if (itr == module_to_info.end())
		return true;

	const DeferredEntryPoint *deferred_entry_point = nullptr;
	for (auto &entry : itr->second.deferred_entry_points)
	{
		if (target_model == entry.execution_model && entry.name == info.pName)
		{
			deferred_entry_point = &entry;
			break;
		}
	}

	if (deferred_entry_point)
	{
		auto &entry = *deferred_entry_point;
		uint32_t wg_size[3] = {};

		if (entry.execution_model == spv::ExecutionModelMeshEXT)
		{
			if (entry.max_primitives > props.mesh_shader.maxMeshOutputPrimitives)
				return false;
			if (entry.max_vertices > props.mesh_shader.maxMeshOutputVertices)
				return false;
		}

		for (unsigned i = 0; i < 3; i++)
		{
			wg_size[i] = entry.wg_size_literal[i];
			if (entry.has_constant_id[i] && info.pSpecializationInfo)
			{
				auto *data = static_cast<const uint8_t *>(info.pSpecializationInfo->pData);
				for (unsigned j = 0; j < info.pSpecializationInfo->mapEntryCount; j++)
				{
					auto &map_entry = info.pSpecializationInfo->pMapEntries[j];
					if (map_entry.constantID == entry.constant_id[i] &&
					    map_entry.size == sizeof(uint32_t) &&
					    map_entry.offset + sizeof(uint32_t) <= info.pSpecializationInfo->dataSize)
					{
						memcpy(&wg_size[i], data + map_entry.offset, sizeof(uint32_t));
						break;
					}
				}
			}

			if (wg_size[i] > limit_workgroup_size[i])
				return false;
		}

		if (wg_size[0] * wg_size[1] * wg_size[2] > limit_invocations)
			return false;

		if (info.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT)
		{
			auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
					VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
					info.pNext);

			uint32_t target_subgroup_size = required ?
					required->requiredSubgroupSize : props.subgroup_size_control.maxSubgroupSize;

			if (!target_subgroup_size)
				return false;

			if (wg_size[0] % target_subgroup_size != 0)
			{
				// Can only use full subgroups if we're guaranteed maxSubgroupSize is contained.
				// If we're using required size, we can statically validate it.
				return false;
			}
		}
	}

	return true;
}